

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

void __thiscall
kratos::ModuleInstantiationStmt::ModuleInstantiationStmt
          (ModuleInstantiationStmt *this,Generator *target,Generator *parent)

{
  _Base_ptr p_Var1;
  Port *local_50;
  ModuleInstantiationStmt *local_40;
  InstantiationStmt *local_38;
  
  Stmt::Stmt(&this->super_Stmt,ModuleInstantiation);
  local_38 = &this->super_InstantiationStmt;
  InstantiationStmt::InstantiationStmt(local_38);
  (this->super_Stmt).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002acef8;
  (this->super_InstantiationStmt)._vptr_InstantiationStmt =
       (_func_int **)&PTR_instantiation_type_002acf78;
  this->target_ = target;
  local_40 = this;
  for (p_Var1 = (target->ports_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(target->ports_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    Generator::get_port((Generator *)&stack0xffffffffffffffb0,(string *)target);
    InstantiationStmt::process_port(local_38,local_50,parent,&target->name);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffb8);
  }
  target->has_instantiated_ = true;
  return;
}

Assistant:

ModuleInstantiationStmt::ModuleInstantiationStmt(Generator *target, Generator *parent)
    : Stmt(StatementType::ModuleInstantiation), target_(target) {
    auto const &port_names = target->get_port_names();
    for (auto const &port_name : port_names) {
        auto const &port_shared = target->get_port(port_name);
        auto *port = port_shared.get();
        process_port(port, parent, target->name);
    }
    target->has_instantiated() = true;
}